

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

void __thiscall
pybind11::arg_v::arg_v<char_const(&)[8]>(arg_v *this,arg *base,char (*x) [8],char *descr)

{
  undefined8 uVar1;
  handle hVar2;
  allocator local_19;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  hVar2 = detail::type_caster<char,_void>::cast(*x,automatic,(handle)0x0);
  (this->value).super_handle.m_ptr = hVar2.m_ptr;
  this->descr = descr;
  std::__cxx11::string::string((string *)&this->type,"A8_c",&local_19);
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }